

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall cs::internal_error::~internal_error(internal_error *this)

{
  ~internal_error(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~internal_error() override = default;